

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEvS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  ulong uVar6;
  ParseContext *ctx_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ushort *puVar10;
  
  if (data.field_0._0_2_ != 0) {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  puVar5 = *(uint **)((long)&table->has_bits_offset +
                     ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar8 = (ulong)ptr[2];
  if ((long)uVar8 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[3] << 7 | 0x7f);
    if ((long)ctx_00 < 0) {
      uVar6 = (long)ptr[4] << 0xe | 0x3fff;
      if ((long)uVar6 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[5] << 0x15 | 0x1fffffU));
        if ((long)ctx_00 < 0) {
          uVar6 = uVar6 & ((long)ptr[6] << 0x1c | 0xfffffffU);
          if ((long)uVar6 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[7] << 0x23 | 0x7ffffffffU));
            if ((long)ctx_00 < 0) {
              uVar6 = uVar6 & ((long)ptr[8] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar6 < 0) {
                ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[9] << 0x31 | 0x1ffffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  uVar6 = uVar6 & ((ulong)(byte)ptr[10] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar6 < 0) {
                    puVar10 = (ushort *)(ptr + 0xc);
                    if ((ptr[0xb] != '\x01') && (ptr[0xb] < '\0')) {
                      pcVar4 = Error(msg,ptr,ctx_00,data,table,hasbits);
                      return pcVar4;
                    }
                  }
                  else {
                    puVar10 = (ushort *)(ptr + 0xb);
                  }
                }
                else {
                  puVar10 = (ushort *)(ptr + 10);
                }
              }
              else {
                puVar10 = (ushort *)(ptr + 9);
              }
            }
            else {
              puVar10 = (ushort *)(ptr + 8);
            }
          }
          else {
            puVar10 = (ushort *)(ptr + 7);
          }
        }
        else {
          puVar10 = (ushort *)(ptr + 6);
        }
      }
      else {
        puVar10 = (ushort *)(ptr + 5);
      }
      ctx_00 = (ParseContext *)((ulong)ctx_00 & uVar6);
    }
    else {
      puVar10 = (ushort *)(ptr + 4);
    }
    uVar8 = uVar8 & (ulong)ctx_00;
  }
  else {
    puVar10 = (ushort *)(ptr + 3);
  }
  uVar9 = (ulong)(*puVar5 >> 0x10);
  iVar7 = (int)uVar8;
  uVar8 = (long)iVar7 - (long)(short)*puVar5;
  uVar6 = uVar8 - uVar9;
  if (uVar9 <= uVar8) {
    uVar2 = puVar5[1];
    if (uVar6 < (uVar2 & 0xffff)) {
      if ((puVar5[(uVar6 >> 5) + 2] >> ((uint)uVar6 & 0x1f) & 1) == 0) {
LAB_002649c9:
        pcVar4 = FastUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar4;
      }
    }
    else {
      uVar8 = 0;
      do {
        if (uVar2 >> 0x10 <= uVar8) goto LAB_002649c9;
        iVar1 = *(int *)((long)puVar5 + uVar8 * 4 + (ulong)(uVar2 >> 3 & 0x1ffc) + 8);
        uVar8 = (uVar8 * 2 - (ulong)(iVar7 < iVar1)) + 2;
      } while (iVar1 != iVar7);
    }
  }
  uVar8 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  piVar3 = RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
  *piVar3 = iVar7;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar5 = *puVar5 | (uint)uVar8;
    }
    return (char *)puVar10;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*puVar10;
  if ((uVar2 & 7) == 0) {
    uVar6 = (ulong)(uVar2 & 0xfffffff8);
    pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                               (msg,puVar10,ctx,
                                (ulong)*puVar10 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),
                                table,uVar8);
    return pcVar4;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnum<uint16_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}